

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O3

string * to_hex_string_abi_cxx11_(string *__return_storage_ptr__,double d)

{
  uint *puVar1;
  long lVar2;
  long lVar3;
  anon_union_8_2_94730070 v;
  stringstream ss;
  stringstream local_1a8 [16];
  long local_198 [2];
  undefined8 uStack_188;
  uint auStack_180 [22];
  ios_base local_128 [112];
  char acStack_b8 [152];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"0x",2);
  lVar3 = 8;
  do {
    *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
         *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffffb5 | 8;
    *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
    lVar2 = *(long *)(local_198[0] + -0x18);
    if (acStack_b8[lVar2 + 1] == '\0') {
      std::ios::widen((char)(ostream *)local_198 + (char)lVar2);
      acStack_b8[lVar2 + 1] = '\x01';
    }
    acStack_b8[lVar2] = '0';
    puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
    *puVar1 = *puVar1 | 0x4000;
    std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_hex_string(double d) {
    std::stringstream ss;
    ss << "0x";
    union {
        double d;
        unsigned char s[8];
    } v;
    v.d = d;
    for (int i = 0; i < 8; ++i) {
        ss << std::hex 
            << std::setw(2) 
            << std::setfill('0') 
            << std::uppercase 
            << (unsigned)v.s[7-i];
    }
    return ss.str();
}